

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCallTransitions.cpp
# Opt level: O2

void BubbleSortArray(NULLCArray arr,NULLCFuncPtr comparator)

{
  undefined4 uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  
  pcVar6 = arr.ptr;
  uVar3 = (ulong)arr.len;
  uVar7 = 0;
  while( true ) {
    uVar8 = uVar3 + 0xfffffffe;
    uVar5 = uVar3;
    if (uVar7 == uVar3) break;
    while (uVar5 = uVar5 - 1, uVar7 < uVar5) {
      uVar4 = uVar8 & 0xffffffff;
      nullcCallFunction(comparator.context,(ulong)comparator.id,(ulong)*(uint *)(pcVar6 + uVar5 * 4)
                        ,(ulong)*(uint *)(pcVar6 + uVar4 * 4));
      iVar2 = nullcGetResultInt();
      if (iVar2 != 0) {
        uVar1 = *(undefined4 *)(pcVar6 + uVar5 * 4);
        *(undefined4 *)(pcVar6 + uVar5 * 4) = *(undefined4 *)(pcVar6 + uVar4 * 4);
        *(undefined4 *)(pcVar6 + uVar4 * 4) = uVar1;
      }
      uVar8 = uVar8 - 1;
    }
    uVar7 = uVar7 + 1;
  }
  return;
}

Assistant:

void BubbleSortArray(NULLCArray arr, NULLCFuncPtr comparator)
{
	int *elem = (int*)arr.ptr;

	for(unsigned int k = 0; k < arr.len; k++)
	{
		for(unsigned int l = arr.len-1; l > k; l--)
		{
			nullcCallFunction(comparator, elem[l], elem[l-1]);
			if(nullcGetResultInt())
			{
				int tmp = elem[l];
				elem[l] = elem[l-1];
				elem[l-1] = tmp;
			}
		}
	}
}